

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

size_t __thiscall gpu::Context::getFreeMemory(Context *this)

{
  Type TVar1;
  element_type *this_00;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  Context local_30;
  size_t free_mem_size;
  size_t total_mem_size;
  Context *this_local;
  
  free_mem_size = 0;
  local_30.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  total_mem_size = (size_t)this;
  TVar1 = type(this);
  if (TVar1 == TypeOpenCL) {
    cl(&local_30);
    this_00 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_30);
    free_mem_size = ocl::OpenCLEngine::totalMemSize(this_00);
    std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_30);
    local_30.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(free_mem_size - free_mem_size / 5);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/context.cpp"
               ,&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"No GPU context!",&local_89);
    raiseException(&local_60,0xd6,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return (size_t)local_30.data_ref_.
                 super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
}

Assistant:

size_t Context::getFreeMemory()
{
	size_t total_mem_size = 0;
	size_t free_mem_size = 0;

	switch (type()) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			CUDA_SAFE_CALL(cudaMemGetInfo(&free_mem_size, &total_mem_size));
			break;
#endif
		case Context::TypeOpenCL:
			total_mem_size = cl()->totalMemSize();
			free_mem_size = total_mem_size - total_mem_size / 5;
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	return free_mem_size;
}